

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

Zyx_Man_t * Zyx_ManAlloc(Bmc_EsPar_t *pPars,word *pTruth)

{
  byte bVar1;
  Bmc_EsPar_t *pBVar2;
  int iVar3;
  int iVar4;
  Zyx_Man_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Wrd_t *pVVar7;
  bmcg_sat_solver *s;
  Vec_Bit_t *pVVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  
  p = (Zyx_Man_t *)calloc(1,0x2278);
  p->pPars = pPars;
  p->pTruth = pTruth;
  iVar12 = pPars->nVars;
  iVar4 = pPars->nNodes;
  iVar14 = iVar4 + iVar12;
  bVar9 = (byte)iVar12;
  iVar3 = 1 << (bVar9 - 6 & 0x1f);
  if (iVar12 < 7) {
    iVar3 = 1;
  }
  p->nObjs = iVar14;
  p->nWords = iVar3;
  bVar1 = (byte)pPars->nLutSize;
  p->LutMask = ~(-1 << (bVar1 & 0x1f));
  iVar3 = iVar4 << (bVar1 & 0x1f);
  p->TopoBase = iVar3;
  iVar3 = iVar3 + iVar14 * iVar4;
  p->MintBase = iVar3;
  iVar14 = iVar14 << (bVar9 & 0x1f);
  iVar12 = iVar14 + iVar3;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < (iVar14 + iVar3) - 1U) {
    iVar4 = iVar12;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar12;
  }
  else {
    piVar6 = (int *)malloc((long)iVar4 << 2);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = iVar12;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,(long)iVar12 << 2);
    }
  }
  p->vVarValues = pVVar5;
  uVar11 = 1 << (bVar9 & 0x1f);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar10 = 0x10;
  if (0x10 < uVar11) {
    uVar10 = uVar11;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar10;
  piVar6 = (int *)malloc((long)(int)uVar10 << 2);
  pVVar5->pArray = piVar6;
  p->vMidMints = pVVar5;
  pVVar7 = Zyx_ManTruthTables(p,pTruth);
  p->vInfo = pVVar7;
  pBVar2 = p->pPars;
  if (pBVar2->fMajority != 0) {
    uVar10 = p->nWords * p->nObjs;
    if (((int)uVar10 < 0) || (pVVar7->nSize <= (int)uVar10)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    pTruth = pVVar7->pArray + uVar10;
  }
  pVVar5 = Zyx_ManCreateSymVarPairs(pTruth,pBVar2->nVars);
  p->vPairs = pVVar5;
  s = bmcg_sat_solver_start();
  p->pSat = s;
  if (pPars->fUseIncr == 0) {
    bVar9 = (byte)pBVar2->nVars;
    iVar14 = p->nObjs;
  }
  else {
    if (pBVar2->nLutSize == 2) {
      iVar14 = p->nObjs;
    }
    else {
      iVar14 = p->nObjs;
      if (pBVar2->fMajority == 0) {
        bVar9 = (byte)pBVar2->nVars;
        if (pBVar2->nLutSize == 3) {
          uVar10 = iVar14 * iVar14 * iVar14 * (pBVar2->nNodes << (bVar9 & 0x1f));
          iVar12 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
          pVVar8 = (Vec_Bit_t *)malloc(0x10);
          pVVar8->nCap = iVar12 * 0x20;
          if (iVar12 == 0) {
            sVar13 = 0;
            piVar6 = (int *)0x0;
          }
          else {
            sVar13 = (long)iVar12 << 2;
            piVar6 = (int *)malloc(sVar13);
          }
          pVVar8->pArray = piVar6;
          pVVar8->nSize = iVar12 * 0x20;
          memset(piVar6,0,sVar13);
          p->vUsed3 = pVVar8;
        }
        goto LAB_005af58f;
      }
    }
    bVar9 = (byte)pBVar2->nVars;
    uVar10 = iVar14 * iVar14 * (pBVar2->nNodes << (bVar9 & 0x1f));
    iVar12 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
    pVVar8 = (Vec_Bit_t *)malloc(0x10);
    pVVar8->nCap = iVar12 * 0x20;
    if (iVar12 == 0) {
      sVar13 = 0;
      piVar6 = (int *)0x0;
    }
    else {
      sVar13 = (long)iVar12 << 2;
      piVar6 = (int *)malloc(sVar13);
    }
    pVVar8->pArray = piVar6;
    pVVar8->nSize = iVar12 * 0x20;
    memset(piVar6,0,sVar13);
    p->vUsed2 = pVVar8;
  }
LAB_005af58f:
  bmcg_sat_solver_set_nvars(s,(iVar14 << (bVar9 & 0x1f)) + p->MintBase);
  Zyx_ManSetupVars(p);
  Zyx_ManAddCnfStart(p);
  Zyx_ManPrintVarMap(p,0);
  return p;
}

Assistant:

Zyx_Man_t * Zyx_ManAlloc( Bmc_EsPar_t * pPars, word * pTruth )
{
    Zyx_Man_t * p = ABC_CALLOC( Zyx_Man_t, 1 );
    p->pPars      = pPars;
    p->pTruth     = pTruth;
    p->nObjs      = p->pPars->nVars + p->pPars->nNodes;
    p->nWords     = Abc_TtWordNum(p->pPars->nVars);
    p->LutMask    = (1 << p->pPars->nLutSize) - 1;
    p->TopoBase   = (1 << p->pPars->nLutSize) * p->pPars->nNodes;
    p->MintBase   = p->TopoBase + p->pPars->nNodes * p->nObjs;
    p->vVarValues = Vec_IntStartFull( p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    p->vMidMints  = Vec_IntAlloc( 1 << p->pPars->nVars );
    p->vInfo      = Zyx_ManTruthTables( p, pTruth );
    p->vPairs     = Zyx_ManCreateSymVarPairs( p->pPars->fMajority ? Zyx_ManTruth(p, p->nObjs) : pTruth, p->pPars->nVars );
    p->pSat       = bmcg_sat_solver_start();
    if ( pPars->fUseIncr )
    {
        if ( p->pPars->nLutSize == 2 || p->pPars->fMajority )
            p->vUsed2     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs );
        else if ( p->pPars->nLutSize == 3 )
            p->vUsed3     = Vec_BitStart( (1 << p->pPars->nVars) * p->pPars->nNodes * p->nObjs * p->nObjs * p->nObjs );
    }
    bmcg_sat_solver_set_nvars( p->pSat, p->MintBase + (1 << p->pPars->nVars) * p->nObjs );
    Zyx_ManSetupVars( p );
    Zyx_ManAddCnfStart( p );
    Zyx_ManPrintVarMap( p, 0 );
    return p;
}